

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

lu_byte luaT_callTMres(lua_State *L,TValue *f,TValue *p1,TValue *p2,StkId res)

{
  byte bVar1;
  StkId pSVar2;
  long lVar3;
  long lVar4;
  
  pSVar2 = (L->top).p;
  lVar4 = (L->stack).offset;
  (pSVar2->val).value_ = f->value_;
  (pSVar2->val).tt_ = f->tt_;
  pSVar2[1].val.value_ = p1->value_;
  *(lu_byte *)((long)pSVar2 + 0x18) = p1->tt_;
  pSVar2[2].val.value_ = p2->value_;
  *(lu_byte *)((long)pSVar2 + 0x28) = p2->tt_;
  (L->top).p = (StkId)((L->top).offset + 0x30);
  if ((L->ci->callstatus & 0x108000) == 0) {
    luaD_call(L,pSVar2,1);
  }
  else {
    luaD_callnoyield(L,pSVar2,1);
  }
  lVar4 = (long)res - lVar4;
  lVar3 = (L->top).offset;
  pSVar2 = (L->stack).p;
  (L->top).p = (StkId)(lVar3 + -0x10);
  *(undefined8 *)((long)pSVar2 + lVar4) = *(undefined8 *)(lVar3 + -0x10);
  bVar1 = *(byte *)(lVar3 + -8);
  *(byte *)((long)pSVar2 + lVar4 + 8) = bVar1;
  return bVar1 & 0x3f;
}

Assistant:

lu_byte luaT_callTMres (lua_State *L, const TValue *f, const TValue *p1,
                        const TValue *p2, StkId res) {
  ptrdiff_t result = savestack(L, res);
  StkId func = L->top.p;
  setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
  setobj2s(L, func + 1, p1);  /* 1st argument */
  setobj2s(L, func + 2, p2);  /* 2nd argument */
  L->top.p += 3;
  /* metamethod may yield only when called from Lua code */
  if (isLuacode(L->ci))
    luaD_call(L, func, 1);
  else
    luaD_callnoyield(L, func, 1);
  res = restorestack(L, result);
  setobjs2s(L, res, --L->top.p);  /* move result to its place */
  return ttypetag(s2v(res));  /* return tag of the result */
}